

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_blitter.cpp
# Opt level: O2

void __thiscall QBlitterPaintEngine::fillRect(QBlitterPaintEngine *this,QRectF *rect,QColor *color)

{
  QBlitterPaintEnginePrivate *this_00;
  bool bVar1;
  int iVar2;
  
  this_00 = (QBlitterPaintEnginePrivate *)
            (this->super_QRasterPaintEngine).super_QPaintEngineEx.super_QPaintEngine.d_ptr.d;
  bVar1 = CapabilitiesToStateMask::canBlitterAlphaFillRect(&this_00->caps);
  if (bVar1) {
    bVar1 = true;
LAB_0036c188:
    QBlitterPaintEnginePrivate::fillRect(this_00,rect,color,bVar1);
    return;
  }
  bVar1 = CapabilitiesToStateMask::canBlitterFillRect(&this_00->caps);
  if (bVar1) {
    iVar2 = QColor::alpha(color);
    if (iVar2 == 0xff) {
      bVar1 = false;
      goto LAB_0036c188;
    }
  }
  QBlitterPaintEnginePrivate::lock(this_00);
  QRasterPaintEngine::fillRect(&this->super_QRasterPaintEngine,rect,color);
  return;
}

Assistant:

void QBlitterPaintEngine::fillRect(const QRectF &rect, const QColor &color)
{
    Q_D(QBlitterPaintEngine);
    if (d->caps.canBlitterAlphaFillRect()) {
        d->fillRect(rect, color, true);
    } else if (d->caps.canBlitterFillRect() && color.alpha() == 0xff) {
        d->fillRect(rect, color, false);
    } else {
        d->lock();
        d->pmData->markRasterOverlay(rect);
        QRasterPaintEngine::fillRect(rect, color);
    }
}